

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

void deqp::gles31::Functional::checkRenderTargetSize(RenderTarget *renderTarget,int minSize)

{
  NotSupportedError *this;
  int minSize_local;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((minSize <= renderTarget->m_width) && (minSize <= renderTarget->m_height)) {
    return;
  }
  minSize_local = minSize;
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  de::toString<int>(&local_58,&minSize_local);
  std::operator+(&local_38,"Render target width and height must be at least ",&local_58);
  tcu::NotSupportedError::NotSupportedError(this,&local_38);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static inline void checkRenderTargetSize (const RenderTarget& renderTarget, int minSize)
{
	if (renderTarget.getWidth() < minSize || renderTarget.getHeight() < minSize)
		throw tcu::NotSupportedError("Render target width and height must be at least " + de::toString(minSize));
}